

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

Integer __thiscall nvim::Nvim::win_get_height(Nvim *this,Window window)

{
  allocator local_41;
  string local_40;
  Integer local_20;
  Integer res;
  Window window_local;
  Nvim *this_local;
  
  res = window;
  window_local = (Window)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"nvim_win_get_height",&local_41);
  NvimRPC::call<long>(&this->client_,&local_40,&local_20,&res);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return local_20;
}

Assistant:

Integer Nvim::win_get_height(Window window) {
    Integer res;
    client_.call("nvim_win_get_height", res, window);
    return res;
}